

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilClearTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::DepthStencilClearCase::DepthStencilClearCase
          (DepthStencilClearCase *this,Context *context,char *name,char *description,int numIters,
          int numClears,bool depth,bool stencil,bool scissor,bool masked)

{
  bool masked_local;
  bool scissor_local;
  bool stencil_local;
  bool depth_local;
  int numClears_local;
  int numIters_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  DepthStencilClearCase *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DepthStencilClearCase_032a19a0;
  this->m_testDepth = depth;
  this->m_testStencil = stencil;
  this->m_testScissor = scissor;
  this->m_masked = masked;
  this->m_numIters = numIters;
  this->m_numClears = numClears;
  this->m_curIter = 0;
  this->m_visProgram = (ShaderProgram *)0x0;
  return;
}

Assistant:

DepthStencilClearCase::DepthStencilClearCase (Context& context, const char* name, const char* description, int numIters, int numClears, bool depth, bool stencil, bool scissor, bool masked)
	: TestCase			(context, name, description)
	, m_testDepth		(depth)
	, m_testStencil		(stencil)
	, m_testScissor		(scissor)
	, m_masked			(masked)
	, m_numIters		(numIters)
	, m_numClears		(numClears)
	, m_curIter			(0)
	, m_visProgram		(DE_NULL)
{
}